

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taylor_math.hpp
# Opt level: O2

taylor<double,_1,_2> *
operator/(taylor<double,_1,_2> *__return_storage_ptr__,int *x,taylor<double,_1,_2> *t)

{
  taylor<double,_1,_2> tmp;
  taylor<double,_1,_2> local_38;
  
  local_38.super_polynomial<double,_1,_2>.c[0] = 0.0;
  local_38.super_polynomial<double,_1,_2>.c[1] = 0.0;
  local_38.super_polynomial<double,_1,_2>.c[2] = 0.0;
  inv_taylor<double,2>(&local_38,(double *)t);
  taylor<double,_1,_2>::operator*=(&local_38,*x);
  (__return_storage_ptr__->super_polynomial<double,_1,_2>).c[0] = 0.0;
  (__return_storage_ptr__->super_polynomial<double,_1,_2>).c[1] = 0.0;
  (__return_storage_ptr__->super_polynomial<double,_1,_2>).c[2] = 0.0;
  taylor<double,_1,_2>::compose<2>(t,__return_storage_ptr__,&local_38);
  return __return_storage_ptr__;
}

Assistant:

static taylor<T, Nvar, Ndeg> operator/(const S & x,
                                       const taylor<T, Nvar, Ndeg> & t) {
#ifdef TAYLOR_LOGGING
  if (taylor_logging)
    cout << "operator/ S templated. x = " << x << endl;
#endif
  taylor<T, 1, Ndeg> tmp;
  inv_taylor(tmp, t[0]);
  tmp *= x;
  taylor<T, Nvar, Ndeg> res;
  t.compose(res, tmp);
  return res;
}